

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_then.cpp
# Opt level: O2

void __thiscall tst_qpromise_then::nullHandler(tst_qpromise_then *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  bool bVar3;
  char cVar4;
  PromiseData<int> *pPVar5;
  QPromiseBase<int> *this_00;
  QPromiseReject<void> *in_R8;
  char *reject;
  PromiseResolver<int> resolver_1;
  QArrayDataPointer<char16_t> local_158;
  int value;
  undefined4 uStack_13c;
  QPromiseBase<int> local_138;
  Promise p_1;
  _Any_data local_118;
  _Manager_type local_108;
  Promise p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_d8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_d0;
  QPromiseBase<int> local_c8;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type p_Stack_a0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_90;
  PromiseResolver<void> resolver;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_40;
  
  local_68._0_4_ = 0x2a;
  QtPromise::QPromise<int>::resolve((QPromise<int> *)&local_118,(int *)local_68._M_pod_data);
  local_b8._M_unused._M_object = (_func_int **)0x0;
  QtPromise::QPromiseBase<int>::then<decltype(nullptr)>
            (&p.super_QPromiseBase<int>,(void **)&local_118);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_118);
  value = 0xffffffff;
  local_158.d = (Data *)&PTR__QPromiseBase_0012d688;
  pPVar5 = (PromiseData<int> *)operator_new(0x58);
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((Data *)((long)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)> + 0x40))->
    super_QSharedData =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  ((Data *)((long)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)> + 0x40))->promise =
       (QPromise<int> *)0x0;
  *(qsizetype *)
   &((Data *)((long)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)> + 0x30))->
    super_QSharedData = 0;
  ((Data *)((long)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)> + 0x30))->promise =
       (QPromise<int> *)0x0;
  ((DataPointer *)
  &((Data *)((long)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)> + 0x20))->
   super_QSharedData)->d = (Data *)0x0;
  ((Data *)((long)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)> + 0x20))->promise =
       (QPromise<int> *)0x0;
  *(undefined8 *)
   &((Data *)((long)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)> + 0x10))->
    super_QSharedData = 0;
  ((Data *)((long)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)> + 0x10))->promise =
       (QPromise<int> *)0x0;
  ((PromiseDataBase<void,_void_()> *)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)((long)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)> + 8) = 0;
  ((exception_ptr *)
  &((Data *)((long)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)> + 0x50))->
   super_QSharedData)->_M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)pPVar5);
  LOCK();
  pQVar1 = (QSharedData *)((long)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)> + 8);
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)((long)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)> + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8._M_unused._M_object = &PTR__QPromiseBase_0012d718;
  local_158.ptr = (char16_t *)pPVar5;
  local_b8._8_8_ = pPVar5;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_b8);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_b8);
  QVar2 = p.super_QPromiseBase<int>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    local_118._M_unused._M_object = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_118._M_unused._0_8_ = (undefined8)resolver;
  }
  local_138._vptr_QPromiseBase = (_func_int **)0x0;
  if ((Data *)local_118._M_unused._0_8_ == (Data *)0x0) {
    p_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    (((Data *)local_118._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_118._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    p_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_118._M_unused._0_8_;
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  if ((Data *)local_118._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_118._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_118._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((PromiseData<int> *)p_1.super_QPromiseBase<int>._vptr_QPromiseBase != (PromiseData<int> *)0x0)
  {
    LOCK();
    (((QAtomicInt *)
     &(((PromiseData<int> *)p_1.super_QPromiseBase<int>._vptr_QPromiseBase)->
      super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
    super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QAtomicInt *)
            &(((PromiseData<int> *)p_1.super_QPromiseBase<int>._vptr_QPromiseBase)->
             super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
           super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_108 = (_Manager_type)&value;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_118._8_8_ = p_1.super_QPromiseBase<int>._vptr_QPromiseBase;
  local_c8._vptr_QPromiseBase = (_func_int **)local_118._M_unused._0_8_;
  local_68._M_unused._M_object = operator_new(0x18);
  *(void **)local_68._M_unused._0_8_ = local_118._M_unused._M_object;
  if ((Data *)local_118._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_118._M_unused._0_8_ = *local_118._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = local_118._8_8_;
  if ((PromiseData<int> *)local_118._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)local_118._8_8_ = *(int *)local_118._8_8_ + 1;
    UNLOCK();
  }
  *(_Manager_type *)((long)local_68._M_unused._0_8_ + 0x10) = local_108;
  pcStack_50 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<int,waitForValue<int>(QtPromise::QPromise<int>const&,int_const&)::{lambda(int_const&)#1}(int_const&)#1},int_const&>
  ::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForValue<int>(QtPromise::QPromise<int>const&,int_const&)::{lambda(int_const&)#1}(int_const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)&local_118);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  QVar2 = p.super_QPromiseBase<int>.m_d;
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            (&local_40,(PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_c8,
             (QPromiseResolve<void> *)&p_1,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)&p_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_c8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_138);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_158.d = (Data *)&PTR__QPromiseBase_0012d718;
  bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  QtPromise::QPromiseBase<void>::wait((QPromiseBase<void> *)&local_118,&local_158);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_118);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_158);
  cVar4 = QTest::qCompare(value,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                          ,0xaa);
  if (cVar4 == '\0') {
    this_00 = &p.super_QPromiseBase<int>;
  }
  else {
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    local_118._M_pod_data[0] = bVar3;
    local_b8._M_pod_data[0] = 1;
    reject = 
    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
    ;
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)local_118._M_pod_data,(bool *)local_b8._M_pod_data,"p.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                       ,0xab);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
    if (!bVar3) {
      return;
    }
    QString::QString((QString *)&local_118,"foo");
    QtPromise::QPromiseBase<int>::reject<QString>
              ((QPromiseBase<int> *)&local_b8,(QString *)&local_118);
    local_158.d = (Data *)0x0;
    QtPromise::QPromiseBase<int>::then<decltype(nullptr)>
              (&p_1.super_QPromiseBase<int>,(void **)&local_b8);
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_118);
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    local_138._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d6e8;
    pPVar5 = (PromiseData<int> *)operator_new(0x68);
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
    *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
    *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
    (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<int>::PromiseData(pPVar5);
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar5 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d820;
    local_138.m_d.d = pPVar5;
    local_c8.m_d.d = pPVar5;
    QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&local_c8);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&local_c8);
    QVar2 = p_1.super_QPromiseBase<int>.m_d;
    if (resolver_1.m_d.d == (Data *)0x0) {
      _value = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      _value = resolver_1.m_d.d;
    }
    local_d0.d = (Data *)0x0;
    if (_value == (Data *)0x0) {
      local_90.d = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)&((PromiseDataBase<void,_void_()> *)&_value->super_QSharedData)->_vptr_PromiseDataBase
           = *(int *)&((PromiseDataBase<void,_void_()> *)&_value->super_QSharedData)->
                      _vptr_PromiseDataBase + 1;
      UNLOCK();
      local_90.d = _value;
    }
    local_d8.d = (Data *)0x0;
    QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
              ((function<void_(const_int_&)> *)&local_118,
               (PromiseHandler<int,decltype(nullptr),void> *)0x0,&value,
               (QPromiseResolve<int> *)&local_90,(QPromiseReject<int> *)reject);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_int_&)> *)&local_118);
    std::_Function_base::~_Function_base((_Function_base *)&local_118);
    QVar2 = p_1.super_QPromiseBase<int>.m_d;
    local_158.d = (Data *)_value;
    if (_value != (Data *)0x0) {
      LOCK();
      *(int *)&((PromiseDataBase<void,_void_()> *)&_value->super_QSharedData)->_vptr_PromiseDataBase
           = *(int *)&((PromiseDataBase<void,_void_()> *)&_value->super_QSharedData)->
                      _vptr_PromiseDataBase + 1;
      UNLOCK();
    }
    local_158.ptr = (char16_t *)local_90.d;
    if ((PromiseData<int> *)local_90.d != (PromiseData<int> *)0x0) {
      LOCK();
      *(int *)&((PromiseDataBase<void,_void_()> *)&(local_90.d)->super_QSharedData)->
               _vptr_PromiseDataBase =
           *(int *)&((PromiseDataBase<void,_void_()> *)&(local_90.d)->super_QSharedData)->
                    _vptr_PromiseDataBase + 1;
      UNLOCK();
    }
    local_b8._M_unused._M_object = (_func_int **)0x0;
    local_b8._8_8_ = (PromiseData<int> *)0x0;
    local_a8 = (_Manager_type)0x0;
    p_Stack_a0 = (_Invoker_type)0x0;
    local_158.size = (qsizetype)&p.super_QPromiseBase<int>;
    local_b8._M_unused._M_object = operator_new(0x18);
    *(Data **)local_b8._M_unused._0_8_ = local_158.d;
    if ((Data *)local_158.d != (Data *)0x0) {
      LOCK();
      *(int *)&((PromiseDataBase<void,_void_()> *)&(local_158.d)->super_QArrayData)->
               _vptr_PromiseDataBase =
           *(int *)&((PromiseDataBase<void,_void_()> *)&(local_158.d)->super_QArrayData)->
                    _vptr_PromiseDataBase + 1;
      UNLOCK();
    }
    *(char16_t **)((long)local_b8._M_unused._0_8_ + 8) = local_158.ptr;
    if ((PromiseData<int> *)local_158.ptr != (PromiseData<int> *)0x0) {
      LOCK();
      *(int *)&((PromiseDataBase<void,_void_()> *)local_158.ptr)->_vptr_PromiseDataBase =
           *(int *)&((PromiseDataBase<void,_void_()> *)local_158.ptr)->_vptr_PromiseDataBase + 1;
      UNLOCK();
    }
    *(qsizetype *)((long)local_b8._M_unused._0_8_ + 0x10) = local_158.size;
    p_Stack_a0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
    QtPromisePrivate::
    PromiseCatcher<int,waitForError<int,QString>(QtPromise::QPromise<int>const&,QString_const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QString_const&)#1},QString_const&>
    ::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(waitForError<int,QString>(QtPromise::QPromise<int>const&,QString_const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QString_const&)#1}const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
    ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
              ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&local_158);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_b8);
    std::_Function_base::~_Function_base((_Function_base *)&local_b8);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_90);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_d8);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&value)
    ;
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_d0);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_1.m_d);
    local_138._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d820;
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p_1.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    if (!bVar3) {
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                (&(p_1.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>);
    }
    QtPromise::QPromiseBase<int>::wait((QPromiseBase<int> *)&local_158,&local_138);
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_158);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&local_138);
    QString::QString((QString *)&local_158,"foo");
    bVar3 = QTest::qCompare((QString *)&p,(QString *)&local_158,"waitForError(p, QString{})",
                            "QString{\"foo\"}",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                            ,0xb0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver);
    if (bVar3) {
      bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isRejected
                        (&(p_1.super_QPromiseBase<int>.m_d.d)->
                          super_PromiseDataBase<int,_void_(const_int_&)>);
      local_158.d = (Data *)CONCAT71(local_158.d._1_7_,bVar3);
      p.super_QPromiseBase<int>._vptr_QPromiseBase =
           (_func_int **)CONCAT71(p.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,1);
      QTest::qCompare<bool,bool>
                ((bool *)&local_158,(bool *)&p,"p.isRejected()","true",
                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                 ,0xb1);
    }
    this_00 = &p_1.super_QPromiseBase<int>;
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(this_00);
  return;
}

Assistant:

void tst_qpromise_then::nullHandler()
{
    { // resolved
        auto p = QtPromise::QPromise<int>::resolve(42).then(nullptr);

        QCOMPARE(waitForValue(p, -1), 42);
        QCOMPARE(p.isFulfilled(), true);
    }
    { // rejected
        auto p = QtPromise::QPromise<int>::reject(QString{"foo"}).then(nullptr);

        QCOMPARE(waitForError(p, QString{}), QString{"foo"});
        QCOMPARE(p.isRejected(), true);
    }
}